

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O2

void __thiscall Node::Node(Node *this,Node *OldNode)

{
  Node *pNVar1;
  int iVar2;
  Node *pNVar3;
  long lVar4;
  
  (this->TextValue)._M_dataplus._M_p = (pointer)&(this->TextValue).field_2;
  (this->TextValue)._M_string_length = 0;
  (this->TextValue).field_2._M_local_buf[0] = '\0';
  this->Type = OldNode->Type;
  std::__cxx11::string::_M_assign((string *)&this->TextValue);
  iVar2 = OldNode->lineno;
  this->FromInclude = OldNode->FromInclude;
  this->lineno = iVar2;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    pNVar1 = OldNode->Tree[lVar4];
    if (pNVar1 == (Node *)0x0) {
      pNVar3 = (Node *)0x0;
    }
    else {
      pNVar3 = (Node *)operator_new(0x70);
      Node(pNVar3,pNVar1);
    }
    this->Tree[lVar4] = pNVar3;
  }
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    pNVar1 = OldNode->Block[lVar4];
    if (pNVar1 == (Node *)0x0) {
      pNVar3 = (Node *)0x0;
    }
    else {
      pNVar3 = (Node *)operator_new(0x70);
      Node(pNVar3,pNVar1);
    }
    this->Block[lVar4] = pNVar3;
  }
  return;
}

Assistant:

Node::Node(
	const Node &OldNode	/**< Node to copy */
)
{
	int loop;		// Generic loop variable

	//
	// Copy over all the easy bits
	//
	Type = OldNode.Type;
	TextValue = OldNode.TextValue;
	Level = OldNode.Level;
	FromInclude = OldNode.FromInclude;
	lineno = OldNode.lineno;

	//
	// Copy over tree entries
	//
	for (loop = 0; loop < 5; loop++)
	{
		if (OldNode.Tree[loop] == 0)
		{
			Tree[loop] = 0;
		}
		else
		{
			//
			// Recursive call here
			//
			Tree[loop] = new Node(*OldNode.Tree[loop]);
		}
	}

	//
	// Copy over block entries
	//
	//	Should we really copy over the block entries?
	//	This may proove to be rather a lot of stuff.
	//
	for (loop = 0; loop < 3; loop++)
	{
		if (OldNode.Block[loop] == 0)
		{
			Block[loop] = 0;
		}
		else
		{
			//
			// Recursive call here
			//
			Block[loop] = new Node(*OldNode.Block[loop]);
		}
	}
}